

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool is_unsigned_glsl_opcode(GLSLstd450 op)

{
  bool local_9;
  GLSLstd450 op_local;
  
  if ((((op == GLSLstd450UMin) || (op == GLSLstd450UMax)) || (op == GLSLstd450UClamp)) ||
     (op == GLSLstd450FindUMsb)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool is_unsigned_glsl_opcode(GLSLstd450 op)
{
	// Don't have to be exhaustive, only relevant for legacy target checking ...
	switch (op)
	{
	case GLSLstd450UClamp:
	case GLSLstd450UMin:
	case GLSLstd450UMax:
	case GLSLstd450FindUMsb:
		return true;

	default:
		return false;
	}
}